

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O0

void __thiscall xe::TestResultParser::updateCurrentItemList(TestResultParser *this)

{
  bool bVar1;
  reference ppIVar2;
  reverse_iterator<__gnu_cxx::__normal_iterator<xe::ri::Item_**,_std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>_>_>
  local_38;
  Type local_2c;
  Item *pIStack_28;
  Type type;
  Item *item;
  reverse_iterator i;
  TestResultParser *this_local;
  
  this->m_curItemList = (List *)0x0;
  i.current._M_current =
       (__normal_iterator<xe::ri::Item_**,_std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>_>
        )(__normal_iterator<xe::ri::Item_**,_std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>_>
          )this;
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::rbegin
            ((vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_> *)&stack0xffffffffffffffe8);
  while( true ) {
    std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::rend
              ((vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_> *)&item);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<xe::ri::Item_**,_std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>_>_>
                             *)&stack0xffffffffffffffe8,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<xe::ri::Item_**,_std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>_>_>
                             *)&item);
    if (!bVar1) break;
    ppIVar2 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<xe::ri::Item_**,_std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<xe::ri::Item_**,_std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>_>_>
                           *)&stack0xffffffffffffffe8);
    pIStack_28 = *ppIVar2;
    local_2c = ri::Item::getType(pIStack_28);
    if (local_2c == TYPE_IMAGESET) {
      this->m_curItemList = (List *)(pIStack_28 + 5);
    }
    else if (local_2c == TYPE_SECTION) {
      this->m_curItemList = (List *)(pIStack_28 + 5);
    }
    else if (local_2c == TYPE_EGLCONFIGSET) {
      this->m_curItemList = (List *)(pIStack_28 + 5);
    }
    else if (local_2c == TYPE_SHADERPROGRAM) {
      this->m_curItemList = (List *)(pIStack_28 + 1);
    }
    if (this->m_curItemList != (List *)0x0) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<xe::ri::Item_**,_std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>_>_>
    ::operator++(&local_38,(int)&stack0xffffffffffffffe8);
  }
  if (this->m_curItemList == (List *)0x0) {
    this->m_curItemList = &this->m_result->resultItems;
  }
  return;
}

Assistant:

void TestResultParser::updateCurrentItemList (void)
{
	m_curItemList = DE_NULL;

	for (vector<ri::Item*>::reverse_iterator i = m_itemStack.rbegin(); i != m_itemStack.rend(); i++)
	{
		ri::Item*	item	= *i;
		ri::Type	type	= item->getType();

		if (type == ri::TYPE_IMAGESET)
			m_curItemList = &static_cast<ri::ImageSet*>(item)->images;
		else if (type == ri::TYPE_SECTION)
			m_curItemList = &static_cast<ri::Section*>(item)->items;
		else if (type == ri::TYPE_EGLCONFIGSET)
			m_curItemList = &static_cast<ri::EglConfigSet*>(item)->configs;
		else if (type == ri::TYPE_SHADERPROGRAM)
			m_curItemList = &static_cast<ri::ShaderProgram*>(item)->shaders;

		if (m_curItemList)
			break;
	}

	if (!m_curItemList)
		m_curItemList = &m_result->resultItems;
}